

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O3

Error __thiscall asmjit::v1_14::BaseEmitter::onAttach(BaseEmitter *this,CodeHolder *code)

{
  Arch AVar1;
  
  this->_code = code;
  this->_environment = code->_environment;
  this->_emitterFlags = this->_emitterFlags | kAttached;
  AVar1 = (code->_environment)._arch;
  (this->_gpSignature)._bits =
       *(uint32_t *)((ulong)AVar1 * 0xd8 + 0x14b014 + (ulong)(AVar1 & 1 ^ 7) * 4);
  (*this->_vptr_BaseEmitter[0x12])();
  return 0;
}

Assistant:

Error BaseEmitter::onAttach(CodeHolder* code) noexcept {
  _code = code;
  _environment = code->environment();
  _addEmitterFlags(EmitterFlags::kAttached);

  const ArchTraits& archTraits = ArchTraits::byArch(code->arch());
  RegType nativeRegType = Environment::is32Bit(code->arch()) ? RegType::kGp32 : RegType::kGp64;
  _gpSignature = archTraits.regTypeToSignature(nativeRegType);

  onSettingsUpdated();
  return kErrorOk;
}